

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_session.c
# Opt level: O3

void nghttp2_session_detach_idle_stream(nghttp2_session *session,nghttp2_stream *stream)

{
  nghttp2_stream *pnVar1;
  nghttp2_stream *pnVar2;
  nghttp2_stream **ppnVar3;
  
  pnVar1 = stream->closed_prev;
  pnVar2 = stream->closed_next;
  ppnVar3 = &pnVar1->closed_next;
  if (pnVar1 == (nghttp2_stream *)0x0) {
    ppnVar3 = &session->idle_stream_head;
  }
  *ppnVar3 = pnVar2;
  ppnVar3 = &pnVar2->closed_prev;
  if (pnVar2 == (nghttp2_stream *)0x0) {
    ppnVar3 = &session->idle_stream_tail;
  }
  *ppnVar3 = pnVar1;
  stream->closed_prev = (nghttp2_stream *)0x0;
  stream->closed_next = (nghttp2_stream *)0x0;
  session->num_idle_streams = session->num_idle_streams - 1;
  return;
}

Assistant:

void nghttp2_session_detach_idle_stream(nghttp2_session *session,
                                        nghttp2_stream *stream) {
  nghttp2_stream *prev_stream, *next_stream;

  DEBUGF("stream: detach idle stream(%p)=%d, state=%d\n", stream,
         stream->stream_id, stream->state);

  prev_stream = stream->closed_prev;
  next_stream = stream->closed_next;

  if (prev_stream) {
    prev_stream->closed_next = next_stream;
  } else {
    session->idle_stream_head = next_stream;
  }

  if (next_stream) {
    next_stream->closed_prev = prev_stream;
  } else {
    session->idle_stream_tail = prev_stream;
  }

  stream->closed_prev = NULL;
  stream->closed_next = NULL;

  --session->num_idle_streams;
}